

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
     PrintValue<pstore::extent<char>,void,std::ostream&>(extent<char> *value,ostream *os)

{
  ostream *poVar1;
  address local_18;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"{addr:",6);
  local_18.a_ = (value->addr).a_.a_;
  poVar1 = pstore::operator<<(os,&local_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",size:",6);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}",1);
  return;
}

Assistant:

static void PrintValue(const T& value, ::std::ostream* os) {
    // Call streaming operator found by ADL, possibly with implicit conversions
    // of the arguments.
    *os << value;
  }